

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

BigNumber *
multiplication_modulaireGN
          (BigNumber *__return_storage_ptr__,BigNumber *a,BigNumber *b,BigNumber *n,int r,
          BigNumber *v,BigNumber *real_r2)

{
  initializer_list<unsigned_int> __l;
  BigNumber local_138;
  BigNumber local_118;
  undefined1 local_f8 [8];
  BigNumber c;
  BigNumber b1;
  BigNumber a1;
  allocator<unsigned_int> local_85;
  uint local_84;
  iterator local_80;
  size_type local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  undefined1 local_58 [8];
  BigNumber unite;
  BigNumber *v_local;
  int r_local;
  BigNumber *n_local;
  BigNumber *b_local;
  BigNumber *a_local;
  
  local_84 = 1;
  local_80 = &local_84;
  local_78 = 1;
  unite.m_base = (unsigned_long)v;
  std::allocator<unsigned_int>::allocator(&local_85);
  __l._M_len = local_78;
  __l._M_array = local_80;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_70,__l,&local_85);
  BigNumber::BigNumber((BigNumber *)local_58,&local_70,a->m_base);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_70);
  std::allocator<unsigned_int>::~allocator(&local_85);
  montgomery((BigNumber *)&b1.m_base,a,real_r2,n,r,(BigNumber *)unite.m_base);
  montgomery((BigNumber *)&c.m_base,b,real_r2,n,r,(BigNumber *)unite.m_base);
  BigNumber::BigNumber((BigNumber *)local_f8,(BigNumber *)&c.m_base);
  montgomery(&local_118,(BigNumber *)local_f8,(BigNumber *)local_f8,n,r,(BigNumber *)unite.m_base);
  BigNumber::operator=((BigNumber *)local_f8,&local_118);
  BigNumber::~BigNumber(&local_118);
  montgomery(&local_138,(BigNumber *)local_f8,(BigNumber *)&c.m_base,n,r,(BigNumber *)unite.m_base);
  BigNumber::operator=((BigNumber *)local_f8,&local_138);
  BigNumber::~BigNumber(&local_138);
  montgomery(__return_storage_ptr__,(BigNumber *)local_f8,(BigNumber *)local_58,n,r,
             (BigNumber *)unite.m_base);
  BigNumber::~BigNumber((BigNumber *)local_f8);
  BigNumber::~BigNumber((BigNumber *)&c.m_base);
  BigNumber::~BigNumber((BigNumber *)&b1.m_base);
  BigNumber::~BigNumber((BigNumber *)local_58);
  return __return_storage_ptr__;
}

Assistant:

BigNumber multiplication_modulaireGN(BigNumber& a, BigNumber& b, BigNumber& n, int r, BigNumber& v, BigNumber& real_r2){
    BigNumber unite({1}, a.m_base);
    BigNumber a1 = montgomery(a, real_r2, n, r, v);
    BigNumber b1 = montgomery(b, real_r2, n, r, v);
    BigNumber c = b1;
    c = montgomery(c, c, n, r, v);
    c = montgomery(c, b1, n, r, v);

    return montgomery(c, unite, n, r, v);
}